

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O3

bool __thiscall crnlib::dxt_image::unpack(dxt_image *this,image_u8 *img)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  color_quad<unsigned_char,_int> *pcVar4;
  uint block_y;
  bool bVar5;
  uint i;
  long lVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uchar *puVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint block_x;
  ulong uVar16;
  int iVar17;
  color_quad_u8 pixels [16];
  ulong local_a8;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_7c;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_78 [18];
  
  uVar1 = this->m_total_elements;
  if (uVar1 != 0) {
    local_7c.m_u32 = 0xff000000;
    image<crnlib::color_quad<unsigned_char,_int>_>::resize
              (img,this->m_width,this->m_height,0xffffffff,
               (color_quad<unsigned_char,_int> *)&local_7c.field_0);
    lVar6 = 0;
    do {
      local_78[lVar6].m_u32 = 0xff000000;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x10);
    uVar16 = (ulong)this->m_blocks_y;
    if (this->m_blocks_y != 0) {
      uVar9 = (ulong)this->m_blocks_x;
      bVar7 = 1;
      iVar10 = 0;
      local_a8 = 0;
      do {
        if ((int)uVar9 == 0) {
          uVar9 = 0;
        }
        else {
          uVar2 = img->m_height;
          block_y = (uint)local_a8;
          uVar15 = uVar2 + block_y * -4;
          if (3 < uVar15) {
            uVar15 = 4;
          }
          iVar17 = 0;
          uVar16 = 0;
          do {
            block_x = (uint)uVar16;
            bVar5 = get_block_pixels(this,block_x,block_y,(color_quad_u8 *)&local_78[0].field_0);
            if (uVar2 != block_y * 4) {
              uVar3 = img->m_width;
              uVar8 = uVar3 + block_x * -4;
              uVar9 = (ulong)uVar8;
              if (3 < uVar8) {
                uVar9 = 4;
              }
              puVar11 = &local_78[0].field_0.a;
              uVar13 = 0;
              iVar12 = iVar10;
              do {
                if (uVar3 != block_x * 4) {
                  uVar14 = 0;
                  do {
                    pcVar4 = img->m_pPixels;
                    uVar8 = img->m_pitch * iVar12 + iVar17 + (int)uVar14;
                    pcVar4[uVar8].field_0.field_0.r = puVar11[uVar14 * 4 + -3];
                    pcVar4[uVar8].field_0.field_0.g = puVar11[uVar14 * 4 + -2];
                    pcVar4[uVar8].field_0.field_0.b = puVar11[uVar14 * 4 + -1];
                    pcVar4[uVar8].field_0.field_0.a = puVar11[uVar14 * 4];
                    uVar14 = uVar14 + 1;
                  } while (uVar14 < uVar9);
                }
                uVar13 = uVar13 + 1;
                iVar12 = iVar12 + 1;
                puVar11 = puVar11 + 0x10;
              } while (uVar13 < uVar15);
            }
            bVar7 = bVar7 & bVar5;
            uVar16 = uVar16 + 1;
            uVar9 = (ulong)this->m_blocks_x;
            iVar17 = iVar17 + 4;
          } while (uVar16 < uVar9);
          uVar16 = (ulong)this->m_blocks_y;
        }
        local_a8 = local_a8 + 1;
        iVar10 = iVar10 + 4;
      } while (local_a8 < uVar16);
      if (bVar7 == 0) {
        console::error("dxt_image::unpack: One or more invalid blocks encountered!");
      }
    }
    img->m_comp_flags = 8;
    if (this->m_num_elements_per_block != 0) {
      uVar15 = 8;
      uVar16 = 0;
      do {
        uVar8 = 1 << (this->m_element_component_index[uVar16] & 0x1fU);
        if (this->m_element_component_index[uVar16] < '\0') {
          uVar8 = 7;
        }
        uVar15 = uVar15 | uVar8;
        img->m_comp_flags = uVar15;
        uVar16 = uVar16 + 1;
      } while (uVar16 < this->m_num_elements_per_block);
    }
    bVar5 = get_dxt_format_has_alpha(this->m_format);
    img->m_comp_flags = (img->m_comp_flags & 0xfffffff7) + (uint)bVar5 * 8;
  }
  return uVar1 != 0;
}

Assistant:

bool dxt_image::unpack(image_u8& img) const {
  if (!m_total_elements)
    return false;

  img.resize(m_width, m_height);

  color_quad_u8 pixels[cDXTBlockSize * cDXTBlockSize];
  for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
    pixels[i].set(0, 0, 0, 255);

  bool all_blocks_valid = true;
  for (uint block_y = 0; block_y < m_blocks_y; block_y++) {
    const uint pixel_ofs_y = block_y * cDXTBlockSize;
    const uint limit_y = math::minimum<uint>(cDXTBlockSize, img.get_height() - pixel_ofs_y);

    for (uint block_x = 0; block_x < m_blocks_x; block_x++) {
      if (!get_block_pixels(block_x, block_y, pixels))
        all_blocks_valid = false;

      const uint pixel_ofs_x = block_x * cDXTBlockSize;

      const uint limit_x = math::minimum<uint>(cDXTBlockSize, img.get_width() - pixel_ofs_x);

      for (uint y = 0; y < limit_y; y++) {
        const uint iy = pixel_ofs_y + y;

        for (uint x = 0; x < limit_x; x++) {
          const uint ix = pixel_ofs_x + x;

          img(ix, iy) = pixels[x + (y << cDXTBlockShift)];
        }
      }
    }
  }

  if (!all_blocks_valid)
    console::error("dxt_image::unpack: One or more invalid blocks encountered!");

  img.reset_comp_flags();
  img.set_component_valid(0, false);
  img.set_component_valid(1, false);
  img.set_component_valid(2, false);
  for (uint i = 0; i < m_num_elements_per_block; i++) {
    if (m_element_component_index[i] < 0) {
      img.set_component_valid(0, true);
      img.set_component_valid(1, true);
      img.set_component_valid(2, true);
    } else
      img.set_component_valid(m_element_component_index[i], true);
  }

  img.set_component_valid(3, get_dxt_format_has_alpha(m_format));

  return true;
}